

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaVCheckCVCSimpleType
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,xmlChar *value,
              xmlSchemaValPtr *retVal,int fireErrors,int normalize,int isNormalized)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  bool bVar4;
  xmlSchemaTypeLinkPtr local_a0;
  xmlSchemaTypeLinkPtr memberLink;
  xmlSchemaValPtr curVal;
  xmlSchemaValPtr prevVal;
  unsigned_long len;
  xmlChar *tmpValue;
  xmlChar *end;
  xmlChar *cur;
  xmlSchemaTypePtr itemType;
  xmlSchemaTypePtr biType;
  xmlChar *normValue;
  xmlSchemaValPtr val;
  xmlParserErrors local_40;
  int valNeeded;
  int ret;
  int fireErrors_local;
  xmlSchemaValPtr *retVal_local;
  xmlChar *value_local;
  xmlSchemaTypePtr type_local;
  xmlNodePtr node_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  local_40 = XML_ERR_OK;
  val._4_4_ = (uint)(retVal != (xmlSchemaValPtr *)0x0);
  normValue = (xmlChar *)0x0;
  biType = (xmlSchemaTypePtr)0x0;
  valNeeded = fireErrors;
  _ret = retVal;
  retVal_local = (xmlSchemaValPtr *)value;
  value_local = (xmlChar *)type;
  type_local = (xmlSchemaTypePtr)node;
  node_local = (xmlNodePtr)actxt;
  if ((retVal != (xmlSchemaValPtr *)0x0) && (*retVal != (xmlSchemaValPtr)0x0)) {
    xmlSchemaFreeValue(*retVal);
    *_ret = (xmlSchemaValPtr)0x0;
  }
  if ((val._4_4_ == 0) && ((*(uint *)(value_local + 0x58) & 0x200000) != 0)) {
    val._4_4_ = 1;
  }
  if (retVal_local == (xmlSchemaValPtr *)0x0) {
    retVal_local = (xmlSchemaValPtr *)0x27390a;
  }
  if (((*(int *)value_local == 1) && (*(int *)(value_local + 0xa0) == 0x2e)) ||
     ((*(uint *)(value_local + 0x58) & 0x100) != 0)) {
    if (((isNormalized == 0) &&
        ((normalize != 0 || ((*(uint *)(value_local + 0x58) & 0x10000000) != 0)))) &&
       (biType = (xmlSchemaTypePtr)
                 xmlSchemaNormalizeValue((xmlSchemaTypePtr)value_local,(xmlChar *)retVal_local),
       biType != (xmlSchemaTypePtr)0x0)) {
      retVal_local = (xmlSchemaValPtr *)biType;
    }
    if (*(int *)value_local == 1) {
      itemType = (xmlSchemaTypePtr)value_local;
    }
    else {
      itemType = *(xmlSchemaTypePtr *)(value_local + 0x70);
      while( true ) {
        bVar4 = false;
        if (itemType != (xmlSchemaTypePtr)0x0) {
          bVar4 = itemType->type != XML_SCHEMA_TYPE_BASIC;
        }
        if (!bVar4) break;
        itemType = itemType->baseType;
      }
      if (itemType == (xmlSchemaTypePtr)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                   "could not get the built-in type");
        goto LAB_0020048d;
      }
    }
    if (*(int *)&node_local->_private == 2) {
      if (itemType->builtInType == 0x15) {
        local_40 = xmlSchemaValidateQName
                             ((xmlSchemaValidCtxtPtr)node_local,(xmlChar *)retVal_local,
                              (xmlSchemaValPtr *)&normValue,val._4_4_);
      }
      else if (itemType->builtInType == 0x1c) {
        local_40 = xmlSchemaValidateNotation
                             ((xmlSchemaValidCtxtPtr)node_local,(xmlSchemaPtr)node_local->parent,
                              (xmlNodePtr)0x0,(xmlChar *)retVal_local,(xmlSchemaValPtr *)&normValue,
                              val._4_4_);
      }
      else if (val._4_4_ == 0) {
        local_40 = xmlSchemaValPredefTypeNodeNoNorm
                             (itemType,(xmlChar *)retVal_local,(xmlSchemaValPtr *)0x0,
                              (xmlNodePtr)type_local);
      }
      else {
        local_40 = xmlSchemaValPredefTypeNodeNoNorm
                             (itemType,(xmlChar *)retVal_local,(xmlSchemaValPtr *)&normValue,
                              (xmlNodePtr)type_local);
      }
    }
    else {
      if (*(int *)&node_local->_private != 1) {
        pp_Var2 = __xmlGenericError();
        p_Var1 = *pp_Var2;
        ppvVar3 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xmlschemas.c"
                  ,0x6109);
        goto LAB_0020048d;
      }
      if (itemType->builtInType == 0x1c) {
        local_40 = xmlSchemaValidateNotation
                             ((xmlSchemaValidCtxtPtr)0x0,(xmlSchemaPtr)node_local->doc,
                              (xmlNodePtr)type_local,(xmlChar *)retVal_local,
                              (xmlSchemaValPtr *)&normValue,val._4_4_);
      }
      else if (val._4_4_ == 0) {
        local_40 = xmlSchemaValPredefTypeNodeNoNorm
                             (itemType,(xmlChar *)retVal_local,(xmlSchemaValPtr *)0x0,
                              (xmlNodePtr)type_local);
      }
      else {
        local_40 = xmlSchemaValPredefTypeNodeNoNorm
                             (itemType,(xmlChar *)retVal_local,(xmlSchemaValPtr *)&normValue,
                              (xmlNodePtr)type_local);
      }
    }
    if (local_40 != XML_ERR_OK) {
      if ((int)local_40 < 0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                   "validating against a built-in type");
        goto LAB_0020048d;
      }
      if ((*(uint *)(value_local + 0x58) & 0x40) == 0) {
        local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
      }
      else {
        local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
      }
    }
    if ((local_40 == XML_ERR_OK) && ((*(uint *)(value_local + 0x58) & 0x8000000) != 0)) {
      local_40 = xmlSchemaValidateFacets
                           ((xmlSchemaAbstractCtxtPtr)node_local,(xmlNodePtr)type_local,
                            (xmlSchemaTypePtr)value_local,itemType->builtInType,
                            (xmlChar *)retVal_local,(xmlSchemaValPtr)normValue,0,valNeeded);
      if (local_40 != XML_ERR_OK) {
        if ((int)local_40 < 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                     "validating facets of atomic simple type");
          goto LAB_0020048d;
        }
        if ((*(uint *)(value_local + 0x58) & 0x40) == 0) {
          local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
        }
        else {
          local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
        }
      }
    }
    else if ((valNeeded != 0) && (0 < (int)local_40)) {
      xmlSchemaSimpleTypeErr
                ((xmlSchemaAbstractCtxtPtr)node_local,local_40,(xmlNodePtr)type_local,
                 (xmlChar *)retVal_local,(xmlSchemaTypePtr)value_local,1);
    }
  }
  else if ((*(uint *)(value_local + 0x58) & 0x40) == 0) {
    if ((*(uint *)(value_local + 0x58) & 0x80) != 0) {
      local_a0 = xmlSchemaGetUnionSimpleTypeMemberTypes((xmlSchemaTypePtr)value_local);
      if (local_a0 == (xmlSchemaTypeLinkPtr)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                   "union simple type has no member types");
LAB_0020048d:
        if (biType != (xmlSchemaTypePtr)0x0) {
          (*xmlFree)(biType);
        }
        if (normValue != (xmlChar *)0x0) {
          xmlSchemaFreeValue((xmlSchemaValPtr)normValue);
        }
        return -1;
      }
      for (; local_a0 != (xmlSchemaTypeLinkPtr)0x0; local_a0 = local_a0->next) {
        if (val._4_4_ == 0) {
          local_40 = xmlSchemaVCheckCVCSimpleType
                               ((xmlSchemaAbstractCtxtPtr)node_local,(xmlNodePtr)type_local,
                                local_a0->type,(xmlChar *)retVal_local,(xmlSchemaValPtr *)0x0,0,1,0)
          ;
        }
        else {
          local_40 = xmlSchemaVCheckCVCSimpleType
                               ((xmlSchemaAbstractCtxtPtr)node_local,(xmlNodePtr)type_local,
                                local_a0->type,(xmlChar *)retVal_local,(xmlSchemaValPtr *)&normValue
                                ,0,1,0);
        }
        if ((int)local_40 < 1) break;
      }
      if (local_40 != XML_ERR_OK) {
        if ((int)local_40 < 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                     "validating members of union simple type");
          goto LAB_0020048d;
        }
        local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
      }
      if ((local_40 == XML_ERR_OK) && ((*(uint *)(value_local + 0x58) & 0x8000000) != 0)) {
        if ((isNormalized == 0) &&
           (((normalize != 0 || ((*(uint *)(value_local + 0x58) & 0x10000000) != 0)) &&
            (biType = (xmlSchemaTypePtr)
                      xmlSchemaNormalizeValue(local_a0->type,(xmlChar *)retVal_local),
            biType != (xmlSchemaTypePtr)0x0)))) {
          retVal_local = (xmlSchemaValPtr *)biType;
        }
        local_40 = xmlSchemaValidateFacets
                             ((xmlSchemaAbstractCtxtPtr)node_local,(xmlNodePtr)type_local,
                              (xmlSchemaTypePtr)value_local,XML_SCHEMAS_UNKNOWN,
                              (xmlChar *)retVal_local,(xmlSchemaValPtr)normValue,0,valNeeded);
        if (local_40 != XML_ERR_OK) {
          if ((int)local_40 < 0) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                       "validating facets of union simple type");
            goto LAB_0020048d;
          }
          local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
        }
      }
      if ((valNeeded != 0) && (0 < (int)local_40)) {
        xmlSchemaSimpleTypeErr
                  ((xmlSchemaAbstractCtxtPtr)node_local,local_40,(xmlNodePtr)type_local,
                   (xmlChar *)retVal_local,(xmlSchemaTypePtr)value_local,1);
      }
    }
  }
  else {
    len = 0;
    prevVal = (xmlSchemaValPtr)0x0;
    curVal = (xmlSchemaValPtr)0x0;
    memberLink = (xmlSchemaTypeLinkPtr)0x0;
    if ((isNormalized == 0) &&
       ((normalize != 0 || ((*(uint *)(value_local + 0x58) & 0x10000000) != 0)))) {
      biType = (xmlSchemaTypePtr)
               xmlSchemaNormalizeValue((xmlSchemaTypePtr)value_local,(xmlChar *)retVal_local);
      if (biType != (xmlSchemaTypePtr)0x0) {
        retVal_local = (xmlSchemaValPtr *)biType;
      }
      isNormalized = 1;
    }
    cur = *(xmlChar **)(value_local + 0x38);
    end = (xmlChar *)retVal_local;
    do {
      while( true ) {
        bVar4 = true;
        if ((*end != ' ') && ((*end < 9 || (bVar4 = true, 10 < *end)))) {
          bVar4 = *end == '\r';
        }
        if (!bVar4) break;
        end = end + 1;
      }
      tmpValue = end;
      while( true ) {
        bVar4 = false;
        if (*tmpValue != '\0') {
          bVar4 = true;
          if ((*tmpValue != ' ') && ((*tmpValue < 9 || (bVar4 = true, 10 < *tmpValue)))) {
            bVar4 = *tmpValue == '\r';
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        if (!bVar4) break;
        tmpValue = tmpValue + 1;
      }
      if (tmpValue == end) break;
      len = (unsigned_long)xmlStrndup(end,(int)tmpValue - (int)end);
      prevVal = (xmlSchemaValPtr)((long)&prevVal->type + 1);
      if (val._4_4_ == 0) {
        local_40 = xmlSchemaVCheckCVCSimpleType
                             ((xmlSchemaAbstractCtxtPtr)node_local,(xmlNodePtr)type_local,
                              (xmlSchemaTypePtr)cur,(xmlChar *)len,(xmlSchemaValPtr *)0x0,valNeeded,
                              0,1);
      }
      else {
        local_40 = xmlSchemaVCheckCVCSimpleType
                             ((xmlSchemaAbstractCtxtPtr)node_local,(xmlNodePtr)type_local,
                              (xmlSchemaTypePtr)cur,(xmlChar *)len,(xmlSchemaValPtr *)&memberLink,
                              valNeeded,0,1);
      }
      if (len != 0) {
        (*xmlFree)((void *)len);
        len = 0;
      }
      if (memberLink != (xmlSchemaTypeLinkPtr)0x0) {
        if (normValue == (xmlChar *)0x0) {
          normValue = (xmlChar *)memberLink;
        }
        else {
          xmlSchemaValueAppend(curVal,(xmlSchemaValPtr)memberLink);
        }
        curVal = (xmlSchemaValPtr)memberLink;
        memberLink = (xmlSchemaTypeLinkPtr)0x0;
      }
      if (local_40 != XML_ERR_OK) {
        if ((int)local_40 < 0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                     "validating an item of list simple type");
          goto LAB_0020048d;
        }
        local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
        break;
      }
      end = tmpValue;
    } while (*tmpValue != '\0');
    if (len != 0) {
      (*xmlFree)((void *)len);
      len = 0;
    }
    if (((local_40 == XML_ERR_OK) && ((*(uint *)(value_local + 0x58) & 0x8000000) != 0)) &&
       (local_40 = xmlSchemaValidateFacets
                             ((xmlSchemaAbstractCtxtPtr)node_local,(xmlNodePtr)type_local,
                              (xmlSchemaTypePtr)value_local,XML_SCHEMAS_UNKNOWN,
                              (xmlChar *)retVal_local,(xmlSchemaValPtr)normValue,
                              (unsigned_long)prevVal,valNeeded), local_40 != XML_ERR_OK)) {
      if ((int)local_40 < 0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)node_local,"xmlSchemaVCheckCVCSimpleType",
                   "validating facets of list simple type");
        goto LAB_0020048d;
      }
      local_40 = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
    }
    if ((valNeeded != 0) && (0 < (int)local_40)) {
      if ((isNormalized == 0) &&
         (biType = (xmlSchemaTypePtr)
                   xmlSchemaNormalizeValue((xmlSchemaTypePtr)value_local,(xmlChar *)retVal_local),
         biType != (xmlSchemaTypePtr)0x0)) {
        retVal_local = (xmlSchemaValPtr *)biType;
      }
      xmlSchemaSimpleTypeErr
                ((xmlSchemaAbstractCtxtPtr)node_local,local_40,(xmlNodePtr)type_local,
                 (xmlChar *)retVal_local,(xmlSchemaTypePtr)value_local,1);
    }
  }
  if (biType != (xmlSchemaTypePtr)0x0) {
    (*xmlFree)(biType);
  }
  if (local_40 == XML_ERR_OK) {
    if (_ret == (xmlSchemaValPtr *)0x0) {
      if (normValue != (xmlChar *)0x0) {
        xmlSchemaFreeValue((xmlSchemaValPtr)normValue);
      }
    }
    else {
      *_ret = (xmlSchemaValPtr)normValue;
    }
  }
  else if (normValue != (xmlChar *)0x0) {
    xmlSchemaFreeValue((xmlSchemaValPtr)normValue);
  }
  return local_40;
}

Assistant:

static int
xmlSchemaVCheckCVCSimpleType(xmlSchemaAbstractCtxtPtr actxt,
			     xmlNodePtr node,
			     xmlSchemaTypePtr type,
			     const xmlChar *value,
			     xmlSchemaValPtr *retVal,
			     int fireErrors,
			     int normalize,
			     int isNormalized)
{
    int ret = 0, valNeeded = (retVal) ? 1 : 0;
    xmlSchemaValPtr val = NULL;
    /* xmlSchemaWhitespaceValueType ws; */
    xmlChar *normValue = NULL;

#define NORMALIZE(atype) \
    if ((! isNormalized) && \
    (normalize || (type->flags & XML_SCHEMAS_TYPE_NORMVALUENEEDED))) { \
	normValue = xmlSchemaNormalizeValue(atype, value); \
	if (normValue != NULL) \
	    value = normValue; \
	isNormalized = 1; \
    }

    if ((retVal != NULL) && (*retVal != NULL)) {
	xmlSchemaFreeValue(*retVal);
	*retVal = NULL;
    }
    /*
    * 3.14.4 Simple Type Definition Validation Rules
    * Validation Rule: String Valid
    */
    /*
    * 1 It is schema-valid with respect to that definition as defined
    * by Datatype Valid in [XML Schemas: Datatypes].
    */
    /*
    * 2.1 If The definition is ENTITY or is validly derived from ENTITY given
    * the empty set, as defined in Type Derivation OK (Simple) ($3.14.6), then
    * the string must be a `declared entity name`.
    */
    /*
    * 2.2 If The definition is ENTITIES or is validly derived from ENTITIES
    * given the empty set, as defined in Type Derivation OK (Simple) ($3.14.6),
    * then every whitespace-delimited substring of the string must be a `declared
    * entity name`.
    */
    /*
    * 2.3 otherwise no further condition applies.
    */
    if ((! valNeeded) && (type->flags & XML_SCHEMAS_TYPE_FACETSNEEDVALUE))
	valNeeded = 1;
    if (value == NULL)
	value = BAD_CAST "";
    if (WXS_IS_ANY_SIMPLE_TYPE(type) || WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr biType; /* The built-in type. */
	/*
	* SPEC (1.2.1) "if {variety} is `atomic` then the string must `match`
	* a literal in the `lexical space` of {base type definition}"
	*/
	/*
	* Whitespace-normalize.
	*/
	NORMALIZE(type);
	if (type->type != XML_SCHEMA_TYPE_BASIC) {
	    /*
	    * Get the built-in type.
	    */
	    biType = type->baseType;
	    while ((biType != NULL) &&
		(biType->type != XML_SCHEMA_TYPE_BASIC))
		biType = biType->baseType;

	    if (biType == NULL) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "could not get the built-in type");
		goto internal_error;
	    }
	} else
	    biType = type;
	/*
	* NOTATIONs need to be processed here, since they need
	* to lookup in the hashtable of NOTATION declarations of the schema.
	*/
	if (actxt->type == XML_SCHEMA_CTXT_VALIDATOR) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(
			(xmlSchemaValidCtxtPtr) actxt,
			((xmlSchemaValidCtxtPtr) actxt)->schema,
			NULL, value, &val, valNeeded);
		    break;
		case XML_SCHEMAS_QNAME:
		    ret = xmlSchemaValidateQName((xmlSchemaValidCtxtPtr) actxt,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else if (actxt->type == XML_SCHEMA_CTXT_PARSER) {
	    switch (biType->builtInType) {
		case XML_SCHEMAS_NOTATION:
		    ret = xmlSchemaValidateNotation(NULL,
			((xmlSchemaParserCtxtPtr) actxt)->schema, node,
			value, &val, valNeeded);
		    break;
		default:
		    /* ws = xmlSchemaGetWhiteSpaceFacetValue(type); */
		    if (valNeeded)
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, &val, node);
		    else
			ret = xmlSchemaValPredefTypeNodeNoNorm(biType,
			    value, NULL, node);
		    break;
	    }
	} else {
	    /*
	    * Validation via a public API is not implemented yet.
	    */
	    TODO
	    goto internal_error;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating against a built-in type");
		goto internal_error;
	    }
	    if (WXS_IS_LIST(type))
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    else
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	}
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Check facets.
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		(xmlSchemaValType) biType->builtInType, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of atomic simple type");
		    goto internal_error;
		}
		if (WXS_IS_LIST(type))
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		else
		    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_1;
	    }
	}
	else if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    } else if (WXS_IS_LIST(type)) {

	xmlSchemaTypePtr itemType;
	const xmlChar *cur, *end;
	xmlChar *tmpValue = NULL;
	unsigned long len = 0;
	xmlSchemaValPtr prevVal = NULL, curVal = NULL;
	/* 1.2.2 if {variety} is `list` then the string must be a sequence
	* of white space separated tokens, each of which `match`es a literal
	* in the `lexical space` of {item type definition}
	*/
	/*
	* Note that XML_SCHEMAS_TYPE_NORMVALUENEEDED will be set if
	* the list type has an enum or pattern facet.
	*/
	NORMALIZE(type);
	/*
	* VAL TODO: Optimize validation of empty values.
	* VAL TODO: We do not have computed values for lists.
	*/
	itemType = WXS_LIST_ITEMTYPE(type);
	cur = value;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    tmpValue = xmlStrndup(cur, end - cur);
	    len++;

	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, &curVal, fireErrors, 0, 1);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node, itemType,
		    tmpValue, NULL, fireErrors, 0, 1);
	    FREE_AND_NULL(tmpValue);
	    if (curVal != NULL) {
		/*
		* Add to list of computed values.
		*/
		if (val == NULL)
		    val = curVal;
		else
		    xmlSchemaValueAppend(prevVal, curVal);
		prevVal = curVal;
		curVal = NULL;
	    }
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating an item of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
		break;
	    }
	    cur = end;
	} while (*cur != 0);
	FREE_AND_NULL(tmpValue);
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * Apply facets (pattern, enumeration).
	    */
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		len, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of list simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_2;
	    }
	}
	if (fireErrors && (ret > 0)) {
	    /*
	    * Report the normalized value.
	    */
	    normalize = 1;
	    NORMALIZE(type);
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
	}
    } else if (WXS_IS_UNION(type)) {
	xmlSchemaTypeLinkPtr memberLink;
	/*
	* TODO: For all datatypes `derived` by `union`  whiteSpace does
	* not apply directly; however, the normalization behavior of `union`
	* types is controlled by the value of whiteSpace on that one of the
	* `memberTypes` against which the `union` is successfully validated.
	*
	* This means that the value is normalized by the first validating
	* member type, then the facets of the union type are applied. This
	* needs changing of the value!
	*/

	/*
	* 1.2.3 if {variety} is `union` then the string must `match` a
	* literal in the `lexical space` of at least one member of
	* {member type definitions}
	*/
	memberLink = xmlSchemaGetUnionSimpleTypeMemberTypes(type);
	if (memberLink == NULL) {
	    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		"union simple type has no member types");
	    goto internal_error;
	}
	/*
	* Always normalize union type values, since we currently
	* cannot store the whitespace information with the value
	* itself; otherwise a later value-comparison would be
	* not possible.
	*/
	while (memberLink != NULL) {
	    if (valNeeded)
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, &val, 0, 1, 0);
	    else
		ret = xmlSchemaVCheckCVCSimpleType(actxt, node,
		    memberLink->type, value, NULL, 0, 1, 0);
	    if (ret <= 0)
		break;
	    memberLink = memberLink->next;
	}
	if (ret != 0) {
	    if (ret < 0) {
		AERROR_INT("xmlSchemaVCheckCVCSimpleType",
		    "validating members of union simple type");
		goto internal_error;
	    }
	    ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	}
	/*
	* Apply facets (pattern, enumeration).
	*/
	if ((ret == 0) && (type->flags & XML_SCHEMAS_TYPE_HAS_FACETS)) {
	    /*
	    * The normalization behavior of `union` types is controlled by
	    * the value of whiteSpace on that one of the `memberTypes`
	    * against which the `union` is successfully validated.
	    */
	    NORMALIZE(memberLink->type);
	    ret = xmlSchemaValidateFacets(actxt, node, type,
		XML_SCHEMAS_UNKNOWN, value, val,
		0, fireErrors);
	    if (ret != 0) {
		if (ret < 0) {
		    AERROR_INT("xmlSchemaVCheckCVCSimpleType",
			"validating facets of union simple type");
		    goto internal_error;
		}
		ret = XML_SCHEMAV_CVC_DATATYPE_VALID_1_2_3;
	    }
	}
	if (fireErrors && (ret > 0))
	    xmlSchemaSimpleTypeErr(actxt, ret, node, value, type, 1);
    }

    if (normValue != NULL)
	xmlFree(normValue);
    if (ret == 0) {
	if (retVal != NULL)
	    *retVal = val;
	else if (val != NULL)
	    xmlSchemaFreeValue(val);
    } else if (val != NULL)
	xmlSchemaFreeValue(val);
    return (ret);
internal_error:
    if (normValue != NULL)
	xmlFree(normValue);
    if (val != NULL)
	xmlSchemaFreeValue(val);
    return (-1);
}